

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  pointer pCVar2;
  int i;
  int iVar3;
  long lVar4;
  char *__filename;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  initializer_list<QString> args;
  QByteArrayView local_1e0;
  QByteArrayView local_1d0;
  QArrayDataPointer<char16_t> local_1c0;
  QArrayDataPointer<char16_t> local_1a8;
  QArrayDataPointer<char16_t> local_190;
  QArrayDataPointer<char16_t> local_178;
  QArrayDataPointer<QString> local_158;
  QMap<QString,_QList<QString>_> local_138;
  QArrayDataPointer<VkSpecParser::Command> local_130;
  QByteArrayView local_118;
  VkSpecParser parser;
  undefined8 local_b8;
  undefined8 uStack_b0;
  int argc_local;
  QArrayDataPointer<char16_t> local_98;
  char *local_80;
  char16_t *local_78;
  undefined8 local_70;
  undefined8 local_68;
  char16_t *local_60;
  undefined8 local_58;
  undefined8 local_50;
  char16_t *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8 = 0xaaaaaaaaaaaaaaaa;
  uStack_b0 = 0xaaaaaaaaaaaaaaaa;
  argc_local = argc;
  QCoreApplication::QCoreApplication((QCoreApplication *)&local_b8,&argc_local,argv,0x60a00);
  parser.m_fn.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  parser.m_fn.d.size = -0x5555555555555556;
  parser.m_versionCommandMapping.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>_>
        )(totally_ordered_wrapper<QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>_*>
          )0xaaaaaaaaaaaaaaaa;
  parser.m_fn.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  parser.m_commands.d.ptr = (Command *)0xaaaaaaaaaaaaaaaa;
  parser.m_commands.d.size = -0x5555555555555556;
  parser.m_reader = (QXmlStreamReader)0xaa;
  parser._17_7_ = 0xaaaaaaaaaaaaaa;
  parser.m_commands.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  parser.m_file = (QFile)0xaa;
  parser._1_7_ = 0xaaaaaaaaaaaaaa;
  parser._8_8_ = 0xaaaaaaaaaaaaaaaa;
  VkSpecParser::VkSpecParser(&parser);
  if (argc_local < 4) {
    local_98.d._0_4_ = 2;
    local_98.size._4_4_ = 0;
    local_98.d._4_4_ = 0;
    local_98.ptr._0_4_ = 0;
    local_98.ptr._4_4_ = 0;
    local_98.size._0_4_ = 0;
    local_80 = "default";
    QMessageLogger::warning
              ((char *)&local_98,
               "Usage: qvkgen input_vk_xml input_license_header output_base\n  For example: qvkgen vulkan/vk.xml vulkan/qvulkanfunctions.header vulkan/qvulkanfunctions"
              );
  }
  else {
    QByteArrayView::QByteArrayView<char_*,_true>(&local_118,argv + 1);
    QVar5.m_data = (storage_type *)local_118.m_size;
    QVar5.m_size = (qsizetype)&local_98;
    QString::fromUtf8(QVar5);
    QString::operator=(&parser.m_fn,(QString *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    bVar1 = VkSpecParser::parse(&parser);
    if (bVar1) {
      local_130.d = parser.m_commands.d.d;
      local_130.ptr = parser.m_commands.d.ptr;
      local_130.size = parser.m_commands.d.size;
      if (parser.m_commands.d.d != (Data *)0x0) {
        LOCK();
        ((parser.m_commands.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((parser.m_commands.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + 1;
        UNLOCK();
      }
      local_138 = (QMap<QString,_QList<QString>_>)
                  (QMap<QString,_QList<QString>_>)parser.m_versionCommandMapping.d.d.ptr;
      if (parser.m_versionCommandMapping.d.d.ptr !=
          (totally_ordered_wrapper<QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>_*>
           )0x0) {
        LOCK();
        *(int *)parser.m_versionCommandMapping.d.d.ptr =
             *(int *)parser.m_versionCommandMapping.d.d.ptr + 1;
        UNLOCK();
      }
      local_158.size = -0x5555555555555556;
      local_178.d = (Data *)0x0;
      local_178.ptr = (char16_t *)0x0;
      local_98.d._0_4_ = 0;
      local_98.d._4_4_ = 0;
      local_98.ptr._0_4_ = 0x10a25e;
      local_98.ptr._4_4_ = 0;
      local_178.size = 0;
      local_98.size._0_4_ = 0x10;
      local_98.size._4_4_ = 0;
      local_80 = (char *)0x0;
      local_190.d = (Data *)0x0;
      local_190.ptr = (char16_t *)0x0;
      local_190.size = 0;
      local_78 = L"vkDestroyInstance";
      local_70 = 0x11;
      local_1a8.d = (Data *)0x0;
      local_1a8.ptr = (char16_t *)0x0;
      local_68 = 0;
      local_60 = L"vkGetInstanceProcAddr";
      local_1a8.size = 0;
      local_58 = 0x15;
      local_50 = 0;
      local_158.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_158.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
      local_1c0.d = (Data *)0x0;
      local_1c0.ptr = (char16_t *)0x0;
      local_48 = L"vkEnumerateInstanceVersion";
      local_1c0.size = 0;
      local_40 = 0x1a;
      args._M_len = 4;
      args._M_array = (iterator)&local_98;
      QList<QString>::QList((QList<QString> *)&local_158,args);
      lVar4 = 0x48;
      do {
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)((long)&local_98.d + lVar4));
        lVar4 = lVar4 + -0x18;
      } while (lVar4 != -0x18);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_190);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
      for (iVar3 = 0; __filename = (char *)(long)iVar3, (long)__filename < local_130.size;
          iVar3 = iVar3 + 1) {
        pCVar2 = QList<VkSpecParser::Command>::data((QList<VkSpecParser::Command> *)&local_130);
        bVar1 = QListSpecialMethods<QString>::contains
                          ((QListSpecialMethods<QString> *)&local_158,
                           (QString *)(pCVar2 + (long)__filename),CaseSensitive);
        if (bVar1) {
          iVar3 = iVar3 + -1;
          QList<VkSpecParser::Command>::remove
                    ((QList<VkSpecParser::Command> *)&local_130,__filename);
        }
      }
      local_98.size._0_4_ = 0xaaaaaaaa;
      local_98.size._4_4_ = 0xaaaaaaaa;
      local_98.d._0_4_ = 0xaaaaaaaa;
      local_98.d._4_4_ = 0xaaaaaaaa;
      local_98.ptr._0_4_ = 0xaaaaaaaa;
      local_98.ptr._4_4_ = 0xaaaaaaaa;
      QByteArrayView::QByteArrayView<char_*,_true>(&local_1d0,argv + 2);
      QVar6.m_data = (storage_type *)local_1d0.m_size;
      QVar6.m_size = (qsizetype)&local_98;
      QString::fromUtf8(QVar6);
      local_178.size = -0x5555555555555556;
      local_178.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_178.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      QByteArrayView::QByteArrayView<char_*,_true>(&local_1e0,argv + 3);
      QVar7.m_data = (storage_type *)local_1e0.m_size;
      QVar7.m_size = (qsizetype)&local_178;
      QString::fromUtf8(QVar7);
      genVulkanFunctionsH((QList<VkSpecParser::Command> *)&local_130,&local_138,(QString *)&local_98
                          ,(QString *)&local_178);
      genVulkanFunctionsPH
                ((QList<VkSpecParser::Command> *)&local_130,&local_138,(QString *)&local_98,
                 (QString *)&local_178);
      genVulkanFunctionsPC
                ((QList<VkSpecParser::Command> *)&local_130,&local_138,(QString *)&local_98,
                 (QString *)&local_178);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_158);
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>_>
      ::~QExplicitlySharedDataPointerV2(&local_138.d);
      QArrayDataPointer<VkSpecParser::Command>::~QArrayDataPointer(&local_130);
      iVar3 = 0;
      goto LAB_00105a7c;
    }
  }
  iVar3 = 1;
LAB_00105a7c:
  VkSpecParser::~VkSpecParser(&parser);
  QCoreApplication::~QCoreApplication((QCoreApplication *)&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int main(int argc, char **argv)
{
    QCoreApplication app(argc, argv);
    VkSpecParser parser;

    if (argc < 4) {
        qWarning("Usage: qvkgen input_vk_xml input_license_header output_base\n"
                 "  For example: qvkgen vulkan/vk.xml vulkan/qvulkanfunctions.header vulkan/qvulkanfunctions");
        return 1;
    }

    parser.setFileName(QString::fromUtf8(argv[1]));

    if (!parser.parse())
        return 1;

    // Now we have a list of functions (commands), including extensions, and a
    // table of Version (1.0, 1.1, 1.2) -> Core functions in that version.
    QList<VkSpecParser::Command> commands = parser.commands();
    QMap<QString, QStringList> versionCommandMapping = parser.versionCommandMapping();

    QStringList ignoredFuncs {
        QStringLiteral("vkCreateInstance"),
        QStringLiteral("vkDestroyInstance"),
        QStringLiteral("vkGetInstanceProcAddr"),
        QStringLiteral("vkEnumerateInstanceVersion")
    };
    for (int i = 0; i < commands.size(); ++i) {
        if (ignoredFuncs.contains(commands[i].cmd.name))
            commands.remove(i--);
    }

    QString licenseHeaderFileName = QString::fromUtf8(argv[2]);
    QString outputBase = QString::fromUtf8(argv[3]);
    genVulkanFunctionsH(commands, versionCommandMapping, licenseHeaderFileName, outputBase);
    genVulkanFunctionsPH(commands, versionCommandMapping, licenseHeaderFileName, outputBase);
    genVulkanFunctionsPC(commands, versionCommandMapping, licenseHeaderFileName, outputBase);

    return 0;
}